

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

bool __thiscall FNodeBuilder::GetPolyExtents(FNodeBuilder *this,int polynum,fixed_t *bbox)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  line_t *plVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  FPrivSeg *pFVar8;
  uint uVar9;
  FPrivVert *pFVar10;
  FPrivSeg *pFVar11;
  long lVar12;
  
  bbox[0] = -0x80000000;
  bbox[1] = 0x7fffffff;
  bbox[2] = 0x7fffffff;
  bbox[3] = -0x80000000;
  uVar6 = (ulong)(this->Segs).Count;
  pFVar8 = (this->Segs).Array;
  uVar7 = 0;
  pFVar11 = pFVar8;
  while( true ) {
    if (uVar6 == uVar7) {
      lVar12 = 0;
      bVar5 = false;
      for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
        pFVar8 = (this->Segs).Array;
        plVar4 = this->Level->Lines;
        iVar1 = *(int *)((long)&pFVar8->linedef + lVar12);
        if ((plVar4[iVar1].special == 5) && (plVar4[iVar1].args[0] == polynum)) {
          AddSegToBBox(this,bbox,(FPrivSeg *)((long)&pFVar8->v1 + lVar12));
          uVar6 = (ulong)(this->Segs).Count;
          bVar5 = true;
        }
        lVar12 = lVar12 + 0x48;
      }
      return bVar5;
    }
    plVar4 = this->Level->Lines;
    if ((plVar4[pFVar11->linedef].special == 1) && (plVar4[pFVar11->linedef].args[0] == polynum))
    break;
    uVar7 = uVar7 + 1;
    pFVar11 = pFVar11 + 1;
  }
  pFVar10 = (this->Vertices).Array;
  iVar1 = pFVar10[(uint)pFVar11->v1].super_FSimpleVert.x;
  iVar2 = pFVar10[(uint)pFVar11->v1].super_FSimpleVert.y;
  uVar9 = 1;
  while( true ) {
    uVar6 = uVar7 & 0xffffffff;
    AddSegToBBox(this,bbox,pFVar8 + uVar6);
    pFVar8 = (this->Segs).Array;
    pFVar10 = (this->Vertices).Array;
    uVar3 = pFVar10[(uint)pFVar8[uVar6].v2].segs;
    uVar7 = (ulong)uVar3;
    if (uVar3 == 0xffffffff) {
      return true;
    }
    pFVar10 = pFVar10 + (uint)pFVar8[uVar6].v2;
    if (((pFVar10->super_FSimpleVert).x ==
         SUB84((double)iVar1 * 1.52587890625e-05 + 103079215104.0,0)) &&
       ((pFVar10->super_FSimpleVert).y ==
        SUB84((double)iVar2 * 1.52587890625e-05 + 103079215104.0,0))) break;
    if ((this->Segs).Count <= uVar9) {
      return true;
    }
    uVar9 = uVar9 + 1;
  }
  return true;
}

Assistant:

bool FNodeBuilder::GetPolyExtents (int polynum, fixed_t bbox[4])
{
	unsigned int i;

	bbox[BOXLEFT] = bbox[BOXBOTTOM] = FIXED_MAX;
	bbox[BOXRIGHT] = bbox[BOXTOP] = FIXED_MIN;

	// Try to find a polyobj marked with a start line
	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_START &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			break;
		}
	}

	if (i < Segs.Size())
	{
		vertex_t start;
		unsigned int vert;
		unsigned int count = 0;

		vert = Segs[i].v1;

		start.set(Vertices[vert].x, Vertices[vert].y);

		do
		{
			AddSegToBBox (bbox, &Segs[i]);
			vert = Segs[i].v2;
			i = Vertices[vert].segs;
			count++;	// to prevent endless loops. Stop when this reaches the number of segs.
		} while (i != DWORD_MAX && (Vertices[vert].x != start.fixX() || Vertices[vert].y != start.fixY()) && count < Segs.Size());

		return true;
	}

	// Try to find a polyobj marked with explicit lines
	bool found = false;

	for (i = 0; i < Segs.Size(); ++i)
	{
		if (Level.Lines[Segs[i].linedef].special == PO_LINE_EXPLICIT &&
			Level.Lines[Segs[i].linedef].args[0] == polynum)
		{
			AddSegToBBox (bbox, &Segs[i]);
			found = true;
		}
	}
	return found;
}